

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cc
# Opt level: O2

ScopedFD __thiscall bssl::TemporaryFile::OpenFD(TemporaryFile *this,int flags)

{
  int iVar1;
  int in_EDX;
  undefined4 in_register_00000034;
  
  if (((undefined8 *)CONCAT44(in_register_00000034,flags))[1] == 0) {
    iVar1 = -1;
  }
  else {
    iVar1 = open(*(char **)CONCAT44(in_register_00000034,flags),in_EDX);
  }
  *(int *)&(this->path_)._M_dataplus._M_p = iVar1;
  return (ScopedFD)(int)this;
}

Assistant:

ScopedFD TemporaryFile::OpenFD(int flags) const {
  if (path_.empty()) {
    return ScopedFD();
  }
#if defined(OPENSSL_WINDOWS)
  return ScopedFD(_open(path_.c_str(), flags));
#else
  return ScopedFD(open(path_.c_str(), flags));
#endif
}